

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc-parse.c
# Opt level: O0

void yy_pop_parser_stack(yyParser_conflict *pParser)

{
  int iVar1;
  yyStackEntry_conflict *yytos;
  yyParser_conflict *pParser_local;
  
  if (-1 < pParser->yyidx) {
    iVar1 = pParser->yyidx;
    pParser->yyidx = iVar1 + -1;
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sPopping %s\n",yyTracePrompt,
              yyTokenName[pParser->yystack[iVar1].major]);
    }
    yy_destructor(pParser,pParser->yystack[iVar1].major,&pParser->yystack[iVar1].minor);
    return;
  }
  __assert_fail("pParser->yyidx>=0",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/build_O0/src/zcc-parse.c"
                ,0x626,"void yy_pop_parser_stack(yyParser *)");
}

Assistant:

static void yy_pop_parser_stack(yyParser *pParser){
  yyStackEntry *yytos;
  assert( pParser->yyidx>=0 );
  yytos = &pParser->yystack[pParser->yyidx--];
#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sPopping %s\n",
      yyTracePrompt,
      yyTokenName[yytos->major]);
  }
#endif
  yy_destructor(pParser, yytos->major, &yytos->minor);
}